

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O2

string_t __thiscall
duckdb::FromBinaryOperator::Operation<duckdb::string_t,duckdb::string_t>
          (FromBinaryOperator *this,string_t input,Vector *result)

{
  uint8_t uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  uint8_t byte;
  string_t target;
  string_t input_local;
  
  input_local.value.pointer.ptr = (char *)input.value._0_8_;
  pcVar4 = input_local.value.pointer.ptr;
  if ((uint)this < 0xd) {
    pcVar4 = input_local.value.pointer.prefix;
  }
  input_local.value._0_8_ = this;
  target = StringVector::EmptyString
                     (input.value._8_8_,(Vector *)(((ulong)this & 0xffffffff) + 7 >> 3),
                      (idx_t)input.value._8_8_);
  pcVar3 = target.value._8_8_;
  uVar2 = target.value._0_4_;
  pcVar5 = target.value.pointer.prefix;
  if (0xc < uVar2) {
    pcVar5 = pcVar3;
  }
  if (((ulong)this & 7) == 0) {
    uVar6 = 0;
  }
  else {
    uVar8 = (uint)this & 7;
    bVar7 = 0;
    for (uVar6 = 0; uVar8 = uVar8 - 1, ((ulong)this & 7) != uVar6; uVar6 = uVar6 + 1) {
      uVar1 = StringUtil::GetBinaryValue(pcVar4[uVar6]);
      bVar7 = bVar7 | uVar1 << ((byte)uVar8 & 0x1f);
    }
    *pcVar5 = bVar7;
    pcVar5 = target.value.pointer.prefix + 1;
    if (0xc < uVar2) {
      pcVar5 = pcVar3 + 1;
    }
  }
  while (uVar6 < ((ulong)this & 0xffffffff)) {
    bVar7 = 0;
    lVar9 = 8;
    while (lVar9 != 0) {
      uVar1 = StringUtil::GetBinaryValue(pcVar4[uVar6]);
      lVar9 = lVar9 + -1;
      bVar7 = bVar7 | uVar1 << ((byte)lVar9 & 0x1f);
      uVar6 = uVar6 + 1;
    }
    *pcVar5 = bVar7;
    pcVar5 = pcVar5 + 1;
  }
  string_t::Finalize(&target);
  return (string_t)target.value;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		if (size > NumericLimits<uint32_t>::Maximum()) {
			throw InvalidInputException("Binary input length larger than 2^32 are not supported");
		}

		D_ASSERT(size <= NumericLimits<uint32_t>::Maximum());
		auto buffer_size = (size + 7) / 8;

		// Allocate empty space
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		// Treated as a single byte
		idx_t i = 0;
		if (size % 8 != 0) {
			uint8_t byte = 0;
			for (idx_t j = size % 8; j > 0; --j) {
				byte |= StringUtil::GetBinaryValue(data[i]) << (j - 1);
				i++;
			}
			*output = static_cast<char>(byte); // binary eh
			output++;
		}

		while (i < size) {
			uint8_t byte = 0;
			for (idx_t j = 8; j > 0; --j) {
				byte |= StringUtil::GetBinaryValue(data[i]) << (j - 1);
				i++;
			}
			*output = static_cast<char>(byte);
			output++;
		}

		target.Finalize();
		return target;
	}